

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8Wrap.c
# Opt level: O2

int fl_XGetUtf8FontAndGlyph(XUtf8FontStruct *font_set,uint ucs,XFontStruct **fnt,unsigned_short *id)

{
  int iVar1;
  int enc;
  int *piVar2;
  int *piVar3;
  XFontStruct **ppXVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  char glyph [2];
  
  iVar1 = font_set->nb_font;
  lVar7 = (long)iVar1;
  if (lVar7 < 1) {
    return -1;
  }
  piVar2 = font_set->ranges;
  piVar3 = font_set->encodings;
  ppXVar4 = font_set->fonts;
  lVar6 = 0;
  while( true ) {
    if (lVar7 == lVar6) {
      return -1;
    }
    lVar8 = lVar6;
    if (ppXVar4[lVar6] != (XFontStruct *)0x0) break;
    lVar6 = lVar6 + 1;
  }
  do {
    if (lVar7 == lVar8) {
LAB_001f62de:
      ucs2fontmap(glyph,0x3f,piVar3[lVar6]);
      lVar8 = lVar6;
LAB_001f62f6:
      *id = (short)glyph << 8 | (ushort)glyph >> 8;
      *fnt = ppXVar4[(int)lVar8];
      return 0;
    }
    if (ppXVar4[lVar8] != (XFontStruct *)0x0) {
      enc = piVar3[lVar8];
      iVar5 = ucs2fontmap(glyph,ucs,enc);
      if ((-1 < iVar5) &&
         ((enc != 0 || ((piVar2[lVar8 * 2] <= (int)ucs && ((int)ucs <= piVar2[lVar8 * 2 + 1])))))) {
        if (iVar1 != (int)lVar8) goto LAB_001f62f6;
        goto LAB_001f62de;
      }
    }
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

int
fl_XGetUtf8FontAndGlyph(XUtf8FontStruct  *font_set,
			unsigned int     ucs,
			XFontStruct      **fnt,
			unsigned short   *id) {

  int             *encodings; /* encodings array */
  XFontStruct     **fonts;    /* fonts array */
  int             fnum;       /* index of the current font in the fonts array*/
  int             first;      /* first valid font index */
  int             nb_font;    /* quantity of fonts in the font array */
  char 		  glyph[2];   /* byte1 and byte2 value of the UTF-8 char */
  int             *ranges;    /* sub range of iso10646 */

  nb_font = font_set->nb_font;

  if (nb_font < 1) {
    /* there is no font in the font_set :-( */
    return -1;
  }

  ranges = font_set->ranges;
  fonts = font_set->fonts;
  encodings = font_set->encodings;
  fnum = 0;

  while(fnum < nb_font && !fonts[fnum]) fnum++;
  if (fnum >= nb_font) {
    /* there is no valid font for the X server */
    return -1;
  }

  first = fnum;

  /*
   * find the first encoding which can be used to draw the glyph
   */
  fnum = first;
  while (fnum < nb_font) {
    if (fonts[fnum] && ucs2fontmap(glyph, ucs, encodings[fnum]) >= 0) {
      if (encodings[fnum] != 0 ||
          ((int)ucs >= ranges[fnum * 2] &&
	   (int)ucs <= ranges[fnum * 2 + 1])) {
	break;
      }
    }
    fnum++;
  }
  if (fnum == nb_font) {
    /* the char is not valid in all encodings ->
     * draw it using the first font :-(
     */
    fnum = first;
    ucs2fontmap(glyph, '?', encodings[fnum]);
  }

  *id = ((unsigned char)glyph[0] << 8) | (unsigned char)glyph[1] ;
  *fnt = fonts[fnum];
  return 0;
}